

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::can_compress_content_type(string *content_type)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  char *in_RDI;
  uint tag;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  bool local_1;
  
  uVar1 = str2tag((string *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((((uVar1 == 0xa0a74526) || (uVar1 == 0x40cb462)) || (uVar1 == 0x301accd8)) ||
     (((uVar1 == 0x36c726b2 || (uVar1 == 0x46348aed)) || (uVar1 == 0x6ebb6a6c)))) {
    local_1 = true;
  }
  else {
    lVar3 = std::__cxx11::string::rfind(in_RDI,0x250792);
    local_1 = false;
    if (lVar3 == 0) {
      uVar2 = udl::operator____t((char *)(CONCAT44(in_stack_ffffffffffffffe4,uVar1) &
                                         0xffffffffffffff),in_stack_ffffffffffffffd8);
      local_1 = uVar1 != uVar2;
    }
  }
  return local_1;
}

Assistant:

inline bool can_compress_content_type(const std::string& content_type) {
            using udl::operator""_t;

            auto tag = str2tag(content_type);

            switch (tag) {
                case "image/svg+xml"_t:
                case "application/javascript"_t:
                case "application/json"_t:
                case "application/xml"_t:
                case "application/protobuf"_t:
                case "application/xhtml+xml"_t: return true;

                default:
                    return !content_type.rfind("text/", 0) && tag != "text/event-stream"_t;
            }
        }